

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_2::IsEnabledByCapabilityOpenCL_2_0
               (ValidationState_t *_,uint32_t capability)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,ImageBasic);
  if (capability < 0x30 && bVar1) {
    bVar2 = (byte)(0xd80000104000 >> ((byte)capability & 0x3f));
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool IsEnabledByCapabilityOpenCL_2_0(ValidationState_t& _,
                                     uint32_t capability) {
  if (_.HasCapability(spv::Capability::ImageBasic)) {
    switch (spv::Capability(capability)) {
      case spv::Capability::ImageReadWrite:
      case spv::Capability::LiteralSampler:
      case spv::Capability::Sampled1D:
      case spv::Capability::Image1D:
      case spv::Capability::SampledBuffer:
      case spv::Capability::ImageBuffer:
        return true;
      default:
        break;
    }
    return false;
  }
  return false;
}